

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdStarter.c
# Opt level: O0

void Cmd_RunStarter(char *pFileName,char *pBinary,char *pCommand,int nCores)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  FILE *__stream;
  size_t sVar4;
  char *__s;
  void *__ptr;
  char *pcVar5;
  FILE *__stream_00;
  abctime aVar6;
  int local_88;
  int local_80;
  abctime clk;
  int Counter;
  int status;
  int c;
  int i;
  int Len;
  int Line;
  int LineMax;
  int nLines;
  char *Buffer;
  char *BufferCopy;
  pthread_t *pThreadIds;
  FILE *pFileTemp;
  FILE *pFile;
  int nCores_local;
  char *pCommand_local;
  char *pBinary_local;
  char *pFileName_local;
  
  aVar3 = Abc_Clock();
  if (nCores < 2) {
    fprintf(_stdout,"The number of cores (%d) should be more than 1.\n",(ulong)(uint)nCores);
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Input file \"%s\" cannot be opened.\n",pFileName);
    }
    else {
      i = 0;
      Len = 0;
      Line = 0;
      while (iVar1 = fgetc(__stream), iVar1 != -1) {
        i = i + 1;
        if (iVar1 == 10) {
          Line = Line + 1;
          Len = Abc_MaxInt(Len,i);
          i = 0;
        }
      }
      if (pBinary == (char *)0x0) {
        local_80 = 0;
      }
      else {
        sVar4 = strlen(pBinary);
        local_80 = (int)sVar4;
      }
      if (pCommand == (char *)0x0) {
        local_88 = 0;
      }
      else {
        sVar4 = strlen(pCommand);
        local_88 = (int)sVar4;
      }
      local_88 = Len * 2 + 100 + local_80 + local_88;
      __s = (char *)malloc((long)local_88);
      __ptr = malloc((long)(Line + 10) << 3);
      if (pCommand != (char *)0x0) {
        rewind(__stream);
        while (pcVar5 = fgets(__s,local_88,__stream), pcVar5 != (char *)0x0) {
          sVar4 = strlen(__s);
          c = (int)sVar4;
          while ((c = c + -1, -1 < c &&
                 ((((__s[c] == '\n' || (__s[c] == '\r')) || (__s[c] == '\t')) || (__s[c] == ' ')))))
          {
            __s[c] = '\0';
          }
          if ((((*__s != '\0') && (*__s != '\n')) &&
              ((*__s != '\r' && ((*__s != '\t' && (*__s != ' ')))))) && (*__s != '#')) {
            __stream_00 = fopen(__s,"rb");
            if (__stream_00 == (FILE *)0x0) {
              fprintf(_stdout,"Starter cannot open file \"%s\".\n",__s);
              fflush(_stdout);
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              if (__s != (char *)0x0) {
                free(__s);
              }
              fclose(__stream);
              return;
            }
            fclose(__stream_00);
          }
        }
      }
      rewind(__stream);
      status = 0;
      while (pcVar5 = fgets(__s,local_88,__stream), pcVar5 != (char *)0x0) {
        sVar4 = strlen(__s);
        c = (int)sVar4;
        while ((c = c + -1, -1 < c &&
               ((((__s[c] == '\n' || (__s[c] == '\r')) || (__s[c] == '\t')) || (__s[c] == ' '))))) {
          __s[c] = '\0';
        }
        if ((((*__s != '\0') && (*__s != '\n')) &&
            ((*__s != '\r' && ((*__s != '\t' && (*__s != ' ')))))) && (*__s != '#')) {
          if (pCommand == (char *)0x0) {
            Buffer = Abc_UtilStrsav(__s);
          }
          else {
            Buffer = (char *)malloc((long)local_88);
            pcVar5 = Extra_FileNameGenericAppend(__s,".txt");
            sprintf(Buffer,"%s -c \"%s; %s\" > %s",pBinary,__s,pCommand,pcVar5);
          }
          fprintf(_stdout,"Calling:  %s\n",Buffer);
          fflush(_stdout);
          do {
            iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
            iVar1 = nThreadsRunning;
            if (iVar2 != 0) {
              __assert_fail("status == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                            ,0xd5,"void Cmd_RunStarter(char *, char *, char *, int)");
            }
            iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
            if (iVar2 != 0) {
              __assert_fail("status == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                            ,0xd7,"void Cmd_RunStarter(char *, char *, char *, int)");
            }
          } while (nCores + -1 <= iVar1);
          iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
          if (iVar1 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xde,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          nThreadsRunning = nThreadsRunning + 1;
          iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          if (iVar1 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xe0,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          iVar1 = pthread_create((pthread_t *)((long)__ptr + (long)status * 8),(pthread_attr_t *)0x0
                                 ,Abc_RunThread,Buffer);
          if (iVar1 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xe3,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          if (Line + 10 <= status) {
            __assert_fail("i < nLines",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xe4,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
        }
        status = status + 1;
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__s != (char *)0x0) {
        free(__s);
      }
      fclose(__stream);
      do {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
        iVar1 = nThreadsRunning;
        if (iVar2 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xed,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        if (iVar2 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xef,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
      } while (iVar1 != 0);
      fprintf(_stdout,"Finished processing commands in file \"%s\".  ",pFileName);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Total wall time",aVar6 - aVar3);
      fflush(_stdout);
    }
  }
  return;
}

Assistant:

void Cmd_RunStarter( char * pFileName, char * pBinary, char * pCommand, int nCores )
{
    FILE * pFile, * pFileTemp;
    pthread_t * pThreadIds;
    char * BufferCopy, * Buffer;
    int nLines, LineMax, Line, Len;
    int i, c, status, Counter;
    abctime clk = Abc_Clock();

    // check the number of cores
    if ( nCores < 2 )
    {
        fprintf( stdout, "The number of cores (%d) should be more than 1.\n", nCores ); 
        return; 
    }

    // open the file and make sure it is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    { 
        fprintf( stdout, "Input file \"%s\" cannot be opened.\n", pFileName ); 
        return; 
    }

    // count the number of lines and the longest line
    nLines = LineMax = Line = 0;
    while ( (c = fgetc(pFile)) != EOF )
    {
        Line++;
        if ( c != '\n' )
            continue;
        nLines++;
        LineMax = Abc_MaxInt( LineMax, Line );
        Line = 0;       
    }
    nLines += 10;
    LineMax += LineMax + 100;
    LineMax += pBinary  ? strlen(pBinary) : 0;
    LineMax += pCommand ? strlen(pCommand) : 0;

    // allocate storage
    Buffer = ABC_ALLOC( char, LineMax );
    pThreadIds = ABC_ALLOC( pthread_t, nLines );

    // check if all files can be opened
    if ( pCommand != NULL )
    {
        // read file names
        rewind( pFile );
        for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
        {
            // remove trailing spaces
            for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
                if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                    Buffer[Len] = 0;
                else
                    break;

            // get command from file
            if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
                continue;

            // try to open the file
            pFileTemp = fopen( Buffer, "rb" );
            if ( pFileTemp == NULL )
            {
                fprintf( stdout, "Starter cannot open file \"%s\".\n", Buffer );
                fflush( stdout );
                ABC_FREE( pThreadIds );
                ABC_FREE( Buffer );
                fclose( pFile );
                return;
            }
            fclose( pFileTemp );
        }
    } 
 
    // read commands and execute at most <num> of them at a time
    rewind( pFile );
    for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
    {
        // remove trailing spaces
        for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
            if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                Buffer[Len] = 0;
            else
                break;

        // get command from file
        if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
            continue;

        // create command
        if ( pCommand != NULL )
        {
            BufferCopy = ABC_ALLOC( char, LineMax );
            sprintf( BufferCopy, "%s -c \"%s; %s\" > %s", pBinary, Buffer, pCommand, Extra_FileNameGenericAppend(Buffer, ".txt") );
        }
        else
            BufferCopy = Abc_UtilStrsav( Buffer );
        fprintf( stdout, "Calling:  %s\n", (char *)BufferCopy );  
        fflush( stdout );

        // wait till there is an empty thread
        while ( 1 )
        {
            status = pthread_mutex_lock(&mutex);   assert(status == 0);
            Counter = nThreadsRunning;
            status = pthread_mutex_unlock(&mutex); assert(status == 0);
            if ( Counter < nCores - 1 )
                break;
//            Sleep( 100 );
        }

        // increament the number of threads running
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        nThreadsRunning++;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);

        // create thread to execute this command
        status = pthread_create( &pThreadIds[i], NULL, Abc_RunThread, (void *)BufferCopy );  assert(status == 0);
        assert( i < nLines );
    }
    ABC_FREE( pThreadIds );
    ABC_FREE( Buffer );
    fclose( pFile );

    // wait for all the threads to finish
    while ( 1 )
    {
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        Counter = nThreadsRunning;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);
        if ( Counter == 0 )
            break;
    }

    // cleanup
//    status = pthread_mutex_destroy(&mutex);   assert(status == 0);
//    mutex = PTHREAD_MUTEX_INITIALIZER;
    fprintf( stdout, "Finished processing commands in file \"%s\".  ", pFileName );
    Abc_PrintTime( 1, "Total wall time", Abc_Clock() - clk );
    fflush( stdout );
}